

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Account::deposit_amount(Account *this,float x)

{
  float local_14;
  Account *pAStack_10;
  float x_local;
  Account *this_local;
  
  local_14 = x;
  pAStack_10 = this;
  while (local_14 <= 0.0) {
    std::operator<<((ostream *)&std::cout,"\n Enter a positive value:\t");
    std::istream::operator>>((istream *)&std::cin,&local_14);
  }
  this->deposit = local_14 + this->deposit;
  return;
}

Assistant:

void Account::deposit_amount(float x)
{
    /*!
     * It helps to deposit money into account by amount x
     */
    while (x <= 0){
        std::cout << "\n Enter a positive value:\t";
        std::cin >> x;
    }
    deposit+=x;
}